

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  _Manager_type p_Var2;
  FILE *__stream;
  _Any_data _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  int *piVar8;
  long lVar9;
  void *pvVar10;
  long *plVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  _func_bool__Any_data_ptr *__tmp_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  char *__nptr;
  bool isInitialized;
  SDL_Window *window;
  thread worker;
  int playbackId;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_3;
  undefined1 local_289;
  _Any_data local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  SDL_Window *local_260;
  long local_258;
  undefined4 local_250;
  undefined4 local_24c;
  string local_248;
  string local_228;
  key_type local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  key_type local_168;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148 [48];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [56];
  
  local_288._8_8_ = local_288._M_unused._M_object;
  parseCmdArguments_abi_cxx11_((int)local_148,(char **)(ulong)(uint)argc);
  local_288._M_unused._M_object = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"c","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_148,(key_type *)&local_288);
  sVar1 = pmVar7->_M_string_length;
  if (sVar1 == 0) {
    lVar9 = 0;
LAB_0010f205:
    if ((sVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2)) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_unused._0_8_ != &local_278) {
      operator_delete(local_288._M_unused._M_object);
    }
    local_24c = (undefined4)lVar9;
    local_288._M_unused._M_object = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"p","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_148,(key_type *)&local_288);
    sVar1 = pmVar7->_M_string_length;
    if (sVar1 == 0) {
      lVar9 = 0;
LAB_0010f313:
      if ((sVar1 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2)) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_unused._0_8_ != &local_278) {
        operator_delete(local_288._M_unused._M_object);
      }
      local_250 = (undefined4)lVar9;
      iVar6 = SDL_Init(0x20);
      __stream = _stderr;
      if (iVar6 == 0) {
        ImGui_PreInit();
        local_260 = (SDL_Window *)SDL_CreateWindow("Waver",0x2fff0000,0x2fff0000,400,600,0x2022);
        pvVar10 = (void *)SDL_GL_CreateContext(local_260);
        SDL_GL_MakeCurrent(local_260,pvVar10);
        SDL_GL_SetSwapInterval(1);
        ImGui_Init(local_260,pvVar10);
        lVar9 = ImGui::GetIO();
        *(undefined8 *)(lVar9 + 0x18) = 0;
        getBinaryPath_abi_cxx11_();
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar14) {
          local_278._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_278._8_8_ = plVar11[3];
          local_288._M_unused._M_object = &local_278;
        }
        else {
          local_278._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_288._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_288._8_8_ = plVar11[1];
        *plVar11 = (long)paVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        bVar4 = ImGui_tryLoadFont((string *)&local_288,17.5,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_unused._0_8_ != &local_278) {
          operator_delete(local_288._M_unused._M_object);
        }
        paVar14 = &local_248.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar14) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (bVar4) {
          bVar5 = false;
        }
        else {
          getBinaryPath_abi_cxx11_();
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_78);
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_248.field_2._M_allocated_capacity = *psVar15;
            local_248.field_2._8_8_ = puVar12[3];
            local_248._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_248.field_2._M_allocated_capacity = *psVar15;
            local_248._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_248._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          bVar5 = ImGui_tryLoadFont(&local_248,17.5,false);
          bVar5 = !bVar5;
        }
        if (!bVar4) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar14) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0]);
          }
        }
        if (bVar5) {
          getBinaryPath_abi_cxx11_();
          plVar11 = (long *)std::__cxx11::string::append((char *)local_98);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_188.field_2._M_allocated_capacity = *psVar15;
            local_188.field_2._8_8_ = plVar11[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar15;
            local_188._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_188._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          bVar4 = ImGui_tryLoadFont(&local_188,17.5,false);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = false;
        }
        if (bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0]);
          }
        }
        if (bVar4) {
          getBinaryPath_abi_cxx11_();
          plVar11 = (long *)std::__cxx11::string::append((char *)local_b8);
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_1a8.field_2._M_allocated_capacity = *psVar15;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar15;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ImGui_tryLoadFont(&local_1a8,17.5,false);
          if (bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p);
            }
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0]);
            }
          }
        }
        getBinaryPath_abi_cxx11_();
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar14) {
          local_278._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_278._8_8_ = plVar11[3];
          local_288._M_unused._M_object = &local_278;
        }
        else {
          local_278._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_288._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_288._8_8_ = plVar11[1];
        *plVar11 = (long)paVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        bVar4 = ImGui_tryLoadFont((string *)&local_288,17.5,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_unused._0_8_ != &local_278) {
          operator_delete(local_288._M_unused._M_object);
        }
        paVar14 = &local_228.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar14) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if (bVar4) {
          bVar5 = false;
        }
        else {
          getBinaryPath_abi_cxx11_();
          plVar11 = (long *)std::__cxx11::string::append((char *)local_d8);
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_228.field_2._M_allocated_capacity = *psVar15;
            local_228.field_2._8_8_ = plVar11[3];
            local_228._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar15;
            local_228._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_228._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          bVar5 = ImGui_tryLoadFont(&local_228,17.5,true);
          bVar5 = !bVar5;
        }
        if (!bVar4) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != paVar14) {
            operator_delete(local_228._M_dataplus._M_p);
          }
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0]);
          }
        }
        if (bVar5) {
          getBinaryPath_abi_cxx11_();
          plVar11 = (long *)std::__cxx11::string::append((char *)local_f8);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_1c8.field_2._M_allocated_capacity = *psVar15;
            local_1c8.field_2._8_8_ = plVar11[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *psVar15;
            local_1c8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1c8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          bVar4 = ImGui_tryLoadFont(&local_1c8,17.5,true);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = false;
        }
        if (bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
        }
        if (bVar4) {
          getBinaryPath_abi_cxx11_();
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_118);
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_1e8.field_2._M_allocated_capacity = *psVar15;
            local_1e8.field_2._8_8_ = puVar12[3];
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *psVar15;
            local_1e8._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_1e8._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ImGui_tryLoadFont(&local_1e8,17.5,true);
          if (bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p);
            }
            if (local_118[0] != local_108) {
              operator_delete(local_118[0]);
            }
          }
        }
        ImGui_SetStyle();
        SDL_EventState(0x1000,1);
        ImGui_NewFrame(local_260);
        ImGui::Render();
        local_289 = 0;
        local_258 = 0;
        local_278._M_allocated_capacity = 0;
        local_278._8_8_ = 0;
        local_288 = (_Any_data)ZEXT816(0);
        plVar11 = (long *)operator_new(0x20);
        *plVar11 = (long)&local_250;
        plVar11[1] = (long)&local_24c;
        plVar11[2] = (long)&local_258;
        plVar11[3] = (long)&local_289;
        p_Var2 = g_doInit.super__Function_base._M_manager;
        local_288._M_unused._M_object = plVar11;
        _Var3 = local_288;
        local_288 = g_doInit.super__Function_base._M_functor;
        g_doInit.super__Function_base._M_functor = _Var3;
        local_278._M_allocated_capacity = (size_type)g_doInit.super__Function_base._M_manager;
        g_doInit.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
             ::_M_manager;
        local_278._8_8_ = g_doInit._M_invoker;
        g_doInit._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
             ::_M_invoke;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_288,&local_288,__destroy_functor);
        }
        p_Var2 = g_setWindowSize.super__Function_base._M_manager;
        local_288._8_8_ = 0;
        local_288._M_unused._M_object = &local_260;
        _Var3 = local_288;
        local_288 = g_setWindowSize.super__Function_base._M_functor;
        g_setWindowSize.super__Function_base._M_functor = _Var3;
        local_278._M_allocated_capacity = (size_type)g_setWindowSize.super__Function_base._M_manager
        ;
        g_setWindowSize.super__Function_base._M_manager =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
             ::_M_manager;
        local_278._8_8_ = g_setWindowSize._M_invoker;
        g_setWindowSize._M_invoker =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
             ::_M_invoke;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_288,&local_288,__destroy_functor);
        }
        p_Var2 = g_mainUpdate.super__Function_base._M_manager;
        local_288._8_8_ = g_mainUpdate.super__Function_base._M_functor._8_8_;
        local_288._M_unused._M_object =
             (void *)g_mainUpdate.super__Function_base._M_functor._M_unused._0_8_;
        local_278._M_allocated_capacity = (size_type)g_mainUpdate.super__Function_base._M_manager;
        g_mainUpdate.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
             ::_M_manager;
        local_278._8_8_ = g_mainUpdate._M_invoker;
        g_mainUpdate._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
             ::_M_invoke;
        g_mainUpdate.super__Function_base._M_functor._M_unused._M_object = &local_289;
        g_mainUpdate.super__Function_base._M_functor._8_8_ = &local_260;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_288,&local_288,__destroy_functor);
        }
        if (g_doInit.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0010fc15:
          std::__throw_bad_function_call();
        }
        bVar4 = (*g_doInit._M_invoker)((_Any_data *)&g_doInit);
        if (bVar4) {
          do {
            if (g_mainUpdate.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_0010fc15;
            bVar4 = (*g_mainUpdate._M_invoker)((_Any_data *)&g_mainUpdate);
          } while (bVar4);
          deinitMain();
          std::thread::join();
          GGWave_deinit();
          ImGui_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          SDL_GL_DeleteContext(pvVar10);
          SDL_DestroyWindow(local_260);
          SDL_CloseAudio();
          iVar6 = 0;
          SDL_Quit();
        }
        else {
          puts("Error: failed to initialize audio");
          iVar6 = -2;
        }
        if (local_258 != 0) {
          std::terminate();
        }
      }
      else {
        uVar13 = SDL_GetError();
        fprintf(__stream,"Error: %s\n",uVar13);
        iVar6 = -1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_148);
      return iVar6;
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"p","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_148,&local_208);
    __nptr = (pmVar7->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(__nptr,(char **)&local_248,10);
    if (local_248._M_dataplus._M_p != __nptr) {
      if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar8 != 0x22)) {
        if (*piVar8 == 0) {
          *piVar8 = iVar6;
        }
        goto LAB_0010f313;
      }
      goto LAB_0010fc3e;
    }
  }
  else {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"c","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_148,&local_168);
    __nptr = (pmVar7->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(__nptr,(char **)&local_208,10);
    if (local_208._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar8 != 0x22)) {
      if (*piVar8 == 0) {
        *piVar8 = iVar6;
      }
      goto LAB_0010f205;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0010fc3e:
  uVar13 = std::__throw_out_of_range("stoi");
  if (local_1e8._M_dataplus._M_p != __nptr) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_148);
  _Unwind_Resume(uVar13);
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 400;
    int windowY = 600;

    // Waver video settings
    //float scale = 0.65;

    //int windowX = scale*570;
    //int windowY = scale*917;

    const char * windowTitle = "Waver";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
    }

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
    }

    ImGui_SetStyle();

    SDL_EventState(SDL_DROPFILE, SDL_ENABLE);

    ImGui_NewFrame(window);
    ImGui::Render();

    // tmp
    //addFile("test0.raw", "test0.raw", std::vector<char>(1024));
    //addFile("test1.jpg", "test0.jpg", std::vector<char>(1024*1024 + 624));
    //addFile("test2.mpv", "test0.mov", std::vector<char>(1024*1024*234 + 53827));

    bool isInitialized = false;
    std::thread worker;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

#ifdef __EMSCRIPTEN__
        initMain();
#else
        worker = initMainAndRunCore();
#endif

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        renderMain();
        updateMain();

        ImGui_EndFrame(window);

#ifdef __EMSCRIPTEN__
        updateCore();
#endif

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    deinitMain();
    worker.join();

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}